

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

fp __thiscall duckdb_fmt::v6::internal::normalize<1>(internal *this,fp value)

{
  int iVar1;
  fp fVar2;
  
  iVar1 = (int)value.f + -10;
  for (; ((ulong)this >> 0x35 & 1) == 0; this = (internal *)((long)this * 2)) {
    iVar1 = iVar1 + -1;
  }
  fVar2.f = (long)this << 10;
  fVar2.e = iVar1;
  fVar2._12_4_ = 0;
  return fVar2;
}

Assistant:

fp normalize(fp value) {
    // Handle subnormals.
    const auto shifted_implicit_bit = fp::implicit_bit << SHIFT;
    while ((value.f & shifted_implicit_bit) == 0) {
      value.f <<= 1;
      --value.e;
    }
    // Subtract 1 to account for hidden bit.
    const auto offset =
        fp::significand_size - fp::double_significand_size - SHIFT - 1;
    value.f <<= offset;
    value.e -= offset;
    return value;
  }